

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O3

void __thiscall
Mesh::Mesh(Mesh *this,vector<float,_std::allocator<float>_> *vertices,
          vector<float,_std::allocator<float>_> *normals,
          vector<float,_std::allocator<float>_> *texcoords,
          vector<float,_std::allocator<float>_> *colors)

{
  std::vector<float,_std::allocator<float>_>::vector(&this->vertices,vertices);
  std::vector<float,_std::allocator<float>_>::vector(&this->normals,normals);
  std::vector<float,_std::allocator<float>_>::vector(&this->texcoords,texcoords);
  std::vector<float,_std::allocator<float>_>::vector(&this->colors,colors);
  return;
}

Assistant:

Mesh::Mesh(std::vector<float>& vertices, std::vector<float>& normals, std::vector<float>& texcoords, std::vector<float>& colors) :
    vertices(vertices),
    normals(normals),
    texcoords(texcoords),
    colors(colors) {

}